

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

Stream * __thiscall kratos::Stream::operator<<(Stream *this,shared_ptr<kratos::Var> *var)

{
  undefined8 uVar1;
  char cVar2;
  ulong uVar3;
  ostream *poVar4;
  element_type *peVar5;
  element_type *this_00;
  string *psVar6;
  Var *var_00;
  undefined1 local_68 [8];
  string var_str;
  string local_38;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_18;
  shared_ptr<kratos::Var> *var_local;
  Stream *this_local;
  
  local_18 = &var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
  var_local = (shared_ptr<kratos::Var> *)this;
  std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)var);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&(this->super_stringstream).field_0x10,"// ");
    peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
    strip_newline(&local_38,&(peVar5->super_IRNode).comment);
    poVar4 = std::operator<<(poVar4,(string *)&local_38);
    cVar2 = endl(this);
    std::operator<<(poVar4,cVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((*(byte *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) & 1) != 0) {
    uVar1 = *(undefined8 *)&(this->super_stringstream).field_0x90;
    peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
    (peVar5->super_IRNode).verilog_ln = (uint32_t)uVar1;
  }
  this_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_18);
  get_var_decl_abi_cxx11_((string *)local_68,(Stream *)this_00,var_00);
  peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_18);
  psVar6 = Var::before_var_str_abi_cxx11_(peVar5);
  poVar4 = std::operator<<((ostream *)&(this->super_stringstream).field_0x10,(string *)psVar6);
  poVar4 = std::operator<<(poVar4,(string *)local_68);
  peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_18);
  psVar6 = Var::after_var_str_abi_cxx11_(peVar5);
  poVar4 = std::operator<<(poVar4,(string *)psVar6);
  poVar4 = std::operator<<(poVar4,";");
  cVar2 = endl(this);
  std::operator<<(poVar4,cVar2);
  std::__cxx11::string::~string((string *)local_68);
  return this;
}

Assistant:

Stream& Stream::operator<<(const std::shared_ptr<Var>& var) {
    if (!var->comment.empty()) (*this) << "// " << strip_newline(var->comment) << endl();

    if (generator_->debug) {
        var->verilog_ln = line_no_;
    }

    auto var_str = get_var_decl(var.get());

    (*this) << var->before_var_str() << var_str << var->after_var_str() << ";" << endl();
    return *this;
}